

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O2

void __thiscall vm::VM::sprint(VM *this)

{
  char_t cVar1;
  int_t addr;
  
  addr = POP<int>(this);
  while( true ) {
    cVar1 = READ<unsigned_char>(this,addr);
    if (cVar1 == '\0') break;
    addr = addr + 1;
    std::operator<<((ostream *)&std::cout,cVar1);
  }
  return;
}

Assistant:

void VM::sprint() {
    auto str = POP<addr_t>();
    // std::cout << reinterpret_cast<const char*>(str);
    char_t ch;
    while ((ch = READ<char_t>(str++)) != '\0') {
        std::cout << ch;
    }
}